

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

void HTS_ModelSet_get_duration(HTS_ModelSet *ms,char *string,double *iw,double *mean,double *vari)

{
  double weight;
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  
  sVar1 = ms->num_states;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    mean[sVar2] = 0.0;
    vari[sVar2] = 0.0;
  }
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < ms->num_voices; uVar4 = uVar4 + 1) {
    weight = iw[uVar4];
    if ((weight != 0.0) || (NAN(weight))) {
      HTS_Model_add_parameter
                ((HTS_Model *)((long)&ms->duration->vector_length + lVar3),2,string,mean,vari,
                 (double *)0x0,weight);
    }
    lVar3 = lVar3 + 0x40;
  }
  return;
}

Assistant:

void HTS_ModelSet_get_duration(HTS_ModelSet * ms, const char *string, const double *iw, double *mean, double *vari)
{
   size_t i;
   size_t len = ms->num_states;

   for (i = 0; i < len; i++) {
      mean[i] = 0.0;
      vari[i] = 0.0;
   }
   for (i = 0; i < ms->num_voices; i++)
      if (iw[i] != 0.0)
         HTS_Model_add_parameter(&ms->duration[i], 2, string, mean, vari, NULL, iw[i]);
}